

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPrimitiveCoverage.cpp
# Opt level: O1

IterateResult __thiscall
glcts::TessellationShaderPrimitiveCoverage::iterate(TessellationShaderPrimitiveCoverage *this)

{
  pointer p_Var1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  deUint32 err;
  undefined4 extraout_var;
  char *description;
  byte bVar5;
  pointer p_Var6;
  _tessellation_levels_set levels_sets;
  GLint gl_max_tess_gen_level_value;
  GLfloat inner_tess_levels_single [2];
  GLfloat outer_tess_levels_single [4];
  _tessellation_levels_set local_88;
  GLint local_6c;
  _tessellation_levels_set local_68;
  undefined1 *local_50;
  GLfloat local_48 [6];
  
  iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  initTest(this);
  local_50 = &DAT_3f8000003f800000;
  local_48[0] = 1.0;
  local_48[1] = 1.0;
  local_48[2] = 1.0;
  local_48[3] = 1.0;
  local_6c = 0;
  (**(code **)(CONCAT44(extraout_var,iVar4) + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,&local_6c);
  err = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
  glu::checkError(err,"glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x2ef);
  drawPatch(this,this->m_triangles_tessellation_po_id,3,3,(GLfloat *)&local_50,local_48);
  bVar2 = verifyDrawBufferContents(this);
  TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
            (&local_88,TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,local_6c,
             TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);
  p_Var6 = local_88.
           super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_88.
      super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_88.
      super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      drawPatch(this,this->m_triangles_tessellation_po_id,3,3,p_Var6->inner,p_Var6->outer);
      bVar3 = verifyDrawBufferContents(this);
      bVar2 = (bool)(bVar2 & bVar3);
      p_Var6 = p_Var6 + 1;
    } while (p_Var6 != local_88.
                       super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  drawPatch(this,this->m_quad_tessellation_po_id,4,6,(GLfloat *)&local_50,local_48);
  bVar3 = verifyDrawBufferContents(this);
  TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
            (&local_68,TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,local_6c,
             TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);
  p_Var1 = local_88.
           super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  p_Var6 = local_88.
           super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_88.
  super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_68.
       super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_88.
  super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_68.
       super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.
  super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.
       super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (p_Var6 != (pointer)0x0) {
    operator_delete(p_Var6,(long)p_Var1 - (long)p_Var6);
  }
  if (local_68.
      super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar5 = bVar2 & bVar3;
  p_Var6 = local_88.
           super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_88.
      super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_88.
      super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      drawPatch(this,this->m_quad_tessellation_po_id,4,6,p_Var6->inner,p_Var6->outer);
      bVar2 = verifyDrawBufferContents(this);
      bVar5 = bVar5 & bVar2;
      p_Var6 = p_Var6 + 1;
    } while (p_Var6 != local_88.
                       super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  description = "Fail";
  if (bVar5 != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar5 ^ 1),
             description);
  if (local_88.
      super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderPrimitiveCoverage::iterate(void)
{
	/* Retriveing GL. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialize test */
	initTest();

	bool has_test_passed = true;

	/* Define tessellation level values that we will use to draw single tessellated primitive */
	const glw::GLfloat inner_tess_levels_single[] = { 1.0f, 1.0f };
	const glw::GLfloat outer_tess_levels_single[] = { 1.0f, 1.0f, 1.0f, 1.0f };

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	glw::GLint gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Verify no cracks can be found if a degenerate triangle
	 * is outputted by the tessellator */
	drawPatch(m_triangles_tessellation_po_id, 3 /* n_patch_vertices */, 3 /* n_triangle_vertices */,
			  inner_tess_levels_single, outer_tess_levels_single);

	has_test_passed &= verifyDrawBufferContents();

	/* Verify no cracks can be found if multiple triangles
	 * are outputted by the tessellator.
	 */
	_tessellation_levels_set levels_sets = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
		TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES, gl_max_tess_gen_level_value,
		TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);

	for (_tessellation_levels_set_const_iterator set_iterator = levels_sets.begin(); set_iterator != levels_sets.end();
		 set_iterator++)
	{
		const _tessellation_levels& set = *set_iterator;

		drawPatch(m_triangles_tessellation_po_id, 3 /* n_patch_vertices */, 3 /* n_triangle_vertices */, set.inner,
				  set.outer);

		has_test_passed &= verifyDrawBufferContents();
	}

	/* Verify no cracks can be found if a degenerate quad
	 * is outputted by the tessellator.
	 */
	drawPatch(m_quad_tessellation_po_id, 4 /* n_patch_vertices */, 6 /* n_triangle_vertices (quad == 2 triangles) */,
			  inner_tess_levels_single, outer_tess_levels_single);

	has_test_passed &= verifyDrawBufferContents();

	/* Verify no cracks can be found if multiple triangles
	 * (to which the generated quads will be broken into)
	 * are outputted by the tessellator.
	 */
	levels_sets = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
		TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS, gl_max_tess_gen_level_value,
		TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);

	for (_tessellation_levels_set_const_iterator set_iterator = levels_sets.begin(); set_iterator != levels_sets.end();
		 set_iterator++)
	{
		const _tessellation_levels& set = *set_iterator;

		drawPatch(m_quad_tessellation_po_id, 4 /* n_patch_vertices */,
				  6 /* n_triangle_vertices (quad == 2 triangles) */, set.inner, set.outer);
		has_test_passed &= verifyDrawBufferContents();
	}

	/* Has the test passed? */
	if (has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}